

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::addFunc
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *this,Name name,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2,ImportNames *param_3,
          TypeUse *type,
          optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *locals,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *param_6
          ,Index pos)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer puVar4;
  pointer pNVar5;
  char *pcVar6;
  pointer pNVar7;
  HeapTypeKind HVar8;
  size_t sVar9;
  ulong uVar10;
  NameType *l;
  pointer pNVar11;
  ulong uVar12;
  Name name_00;
  string local_78;
  Err local_58;
  Result<wasm::Ok> *local_38;
  
  uVar3 = this->index;
  puVar4 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  HVar8 = HeapType::getKind(&type->type);
  local_38 = __return_storage_ptr__;
  if (HVar8 == Func) {
    *(uintptr_t *)
     ((long)puVar4[uVar3]._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t + 0x38)
         = (type->type).id;
    uVar12 = (long)(type->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(type->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4;
    sVar9 = Function::getNumLocals
                      ((Function *)
                       puVar4[uVar3]._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t);
    if (sVar9 < uVar12) {
      uVar12 = sVar9;
    }
    if (uVar12 != 0) {
      uVar12 = 0;
      do {
        pNVar5 = (type->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar6 = pNVar5[uVar12].super_IString.str._M_str;
        if (pcVar6 != (char *)0x0) {
          name_00.super_IString.str._M_str = pcVar6;
          name_00.super_IString.str._M_len = pNVar5[uVar12].super_IString.str._M_len;
          Function::setLocalName
                    ((Function *)
                     puVar4[uVar3]._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t,(Index)uVar12,name_00);
        }
        uVar12 = (ulong)((Index)uVar12 + 1);
        uVar10 = (long)(type->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(type->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4;
        sVar9 = Function::getNumLocals
                          ((Function *)
                           puVar4[uVar3]._M_t.
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t);
        if (sVar9 < uVar10) {
          uVar10 = sVar9;
        }
      } while (uVar12 < uVar10);
    }
    if ((locals->
        super__Optional_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
        ._M_engaged != false) {
      pNVar7 = *(pointer *)
                ((long)&(locals->
                        super__Optional_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl
                + 8);
      for (pNVar11 = *(pointer *)
                      &(locals->
                       super__Optional_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                       ._M_payload._M_value.
                       super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl;
          pNVar11 != pNVar7; pNVar11 = pNVar11 + 1) {
        Builder::addVar((Builder *)
                        puVar4[uVar3]._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t,*(Function **)&(pNVar11->name).super_IString,
                        (Name)*(string_view *)((long)&(pNVar11->name).super_IString + 8),
                        (Type)param_2);
      }
    }
    *(__index_type *)
     ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"expected signature type","");
    Lexer::err(&local_58,&this->in,(ulong)pos,&local_78);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    paVar2 = &local_58.msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.msg._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_58.msg.field_2._M_allocated_capacity._1_7_,
                         local_58.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           local_58.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_58.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(local_58.msg.field_2._M_allocated_capacity._1_7_,
                    local_58.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_58.msg._M_string_length
    ;
    local_58.msg._M_string_length = 0;
    local_58.msg.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      local_58.msg._M_dataplus._M_p = (pointer)paVar2;
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return local_38;
}

Assistant:

Result<> addFunc(Name name,
                   const std::vector<Name>&,
                   ImportNames*,
                   TypeUse type,
                   std::optional<LocalsT> locals,
                   std::vector<Annotation>&&,
                   Index pos) {
    auto& f = wasm.functions[index];
    if (!type.type.isSignature()) {
      return in.err(pos, "expected signature type");
    }
    f->type = type.type;
    // If we are provided with too many names (more than the function has), we
    // will error on that later when we check the signature matches the type.
    // For now, avoid asserting in setLocalName.
    for (Index i = 0; i < std::min(type.names.size(), f->getNumLocals()); ++i) {
      if (type.names[i].is()) {
        f->setLocalName(i, type.names[i]);
      }
    }
    if (locals) {
      for (auto& l : *locals) {
        Builder::addVar(f.get(), l.name, l.type);
      }
    }
    return Ok{};
  }